

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  ID *__k;
  uint uVar1;
  StorageClass SVar2;
  ExecutionModel EVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIREntryPoint *pSVar7;
  SPIRType *pSVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  runtime_error *prVar11;
  Bitset *pBVar12;
  char *pcVar13;
  __hashtable *__h;
  _func_int **pp_Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  bool bVar15;
  uint local_3a4;
  SPIREntryPoint *local_3a0;
  ID *local_398;
  undefined1 local_390 [32];
  string name;
  string binding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string semantic;
  string local_2f0;
  SPIRType newtype;
  SPIRType type;
  
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  pSVar8 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar8);
  binding._M_dataplus._M_p = (pointer)&binding.field_2;
  binding._M_string_length = 0;
  binding.field_2._M_local_buf[0] = '\0';
  bVar15 = var->storage == StorageClassOutput;
  bVar4 = pSVar7->model == ExecutionModelFragment;
  local_3a0 = pSVar7;
  if (bVar15 && bVar4) {
    uVar1 = *(uint *)&(this->super_CompilerGLSL).field_0x241c;
    uVar5 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationIndex);
    uVar6 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (uVar6 != 0 && uVar5 != 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      newtype.super_IVariant._vptr_IVariant = (_func_int **)&newtype.width;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&newtype,"Dual-source blending is only supported on MRT #0 in HLSL.","");
      ::std::runtime_error::runtime_error(prVar11,(string *)&newtype);
      *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar13 = "SV_Target";
    if (uVar1 < 0x1f) {
      pcVar13 = "COLOR";
    }
    semantic._M_dataplus._M_p._0_4_ = uVar6 + uVar5;
    name._M_dataplus._M_p = pcVar13;
    join<char_const*,unsigned_int>
              ((string *)&newtype,(spirv_cross *)&name,(char **)&semantic,(uint *)"COLOR");
    ::std::__cxx11::string::operator=((string *)&binding,(string *)&newtype);
    if (newtype.super_IVariant._vptr_IVariant != (_func_int **)&newtype.width) {
      operator_delete(newtype.super_IVariant._vptr_IVariant);
    }
    if (uVar1 < 0x1f) {
      type.vecsize = 4;
    }
  }
  SVar2 = var->storage;
  EVar3 = local_3a0->model;
  __k = &(var->super_IVariant).self;
  pmVar9 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  local_398 = __k;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&name,this,(ulong)__k->id,1);
  if (bVar15 && bVar4) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])(&newtype,this,&type,&name,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newtype,
               (char (*) [4])0x2ea180,&binding,(char (*) [2])0x2ddbde);
    pp_Var14 = newtype.super_IVariant._vptr_IVariant;
    if (newtype.super_IVariant._vptr_IVariant == (_func_int **)&newtype.width) goto LAB_00212a32;
  }
  else {
    if (((pmVar9->decoration).decoration_flags.lower & 0x40000000) == 0) {
      newtype.super_IVariant._vptr_IVariant =
           (_func_int **)((ulong)newtype.super_IVariant._vptr_IVariant & 0xffffffff00000000);
      bVar15 = false;
      do {
        sVar10 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&active_locations->_M_h,(key_type *)&newtype);
        uVar5 = (uint32_t)newtype.super_IVariant._vptr_IVariant;
        if (sVar10 == 0) break;
        uVar1 = (uint32_t)newtype.super_IVariant._vptr_IVariant + 1;
        newtype.super_IVariant._vptr_IVariant =
             (_func_int **)CONCAT44(newtype.super_IVariant._vptr_IVariant._4_4_,uVar1);
        bVar15 = uVar1 >= 0x40;
      } while (uVar1 < 0x40);
      if (bVar15) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        newtype.super_IVariant._vptr_IVariant = (_func_int **)&newtype.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&newtype,"All locations from 0 to 63 are exhausted.","");
        ::std::runtime_error::runtime_error(prVar11,(string *)&newtype);
        *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar5 = (pmVar9->decoration).location;
    }
    ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
    to_semantic_abi_cxx11_(&semantic,this,uVar5,local_3a0->model,var->storage);
    if ((SVar2 == StorageClassInput && EVar3 == ExecutionModelVertex) && 1 < type.columns) {
      if (type.array.super_VectorView<unsigned_int>.buffer_size != 0) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        newtype.super_IVariant._vptr_IVariant = (_func_int **)&newtype.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&newtype,
                   "Arrays of matrices used as input/output. This is not supported.","");
        ::std::runtime_error::runtime_error(prVar11,(string *)&newtype);
        *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_3a4 = 0;
      if (type.columns != 0) {
        do {
          SPIRType::SPIRType(&newtype,&type);
          newtype.columns = 1;
          pBVar12 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_398->id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     this,pBVar12);
          join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                    (&local_2f0,(spirv_cross *)&name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e7de5,
                     (char (*) [2])&local_3a4,(uint *)ts_3);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                    (&local_330,this,&newtype,&local_2f0,0);
          ts_3 = &semantic;
          CompilerGLSL::
          statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_330,(char (*) [4])0x2ea180,ts_3,(char (*) [2])0x2e7de5,&local_3a4,
                     (char (*) [2])0x2ddbde);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_330._M_dataplus._M_p._4_4_,(uint32_t)local_330._M_dataplus._M_p) !=
              &local_330.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_330._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_390._0_8_ !=
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)(local_390 + 0x10)) {
            operator_delete((void *)local_390._0_8_);
          }
          local_390._0_8_ = active_locations;
          local_330._M_dataplus._M_p._0_4_ = uVar5;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)active_locations,&local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390)
          ;
          newtype.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0035b448;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&newtype.member_name_cache._M_h);
          newtype.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)
              newtype.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
              &newtype.member_type_index_redirection.stack_storage) {
            free(newtype.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
          }
          newtype.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size = 0;
          if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
              newtype.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              ptr != &newtype.member_types.stack_storage) {
            free(newtype.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .ptr);
          }
          newtype.array_size_literal.super_VectorView<bool>.buffer_size = 0;
          if ((AlignedBuffer<bool,_8UL> *)newtype.array_size_literal.super_VectorView<bool>.ptr !=
              &newtype.array_size_literal.stack_storage) {
            free(newtype.array_size_literal.super_VectorView<bool>.ptr);
          }
          newtype.array.super_VectorView<unsigned_int>.buffer_size = 0;
          if ((AlignedBuffer<unsigned_int,_8UL> *)newtype.array.super_VectorView<unsigned_int>.ptr
              != &newtype.array.stack_storage) {
            free(newtype.array.super_VectorView<unsigned_int>.ptr);
          }
          local_3a4 = local_3a4 + 1;
          uVar5 = uVar5 + 1;
        } while (local_3a4 < type.columns);
      }
    }
    else {
      pBVar12 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_398->id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(&newtype,this,pBVar12);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                (local_390,this,&type,&name,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newtype,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                 (char (*) [4])0x2ea180,&semantic,(char (*) [2])0x2ddbde);
      if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)local_390._0_8_ !=
          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)(local_390 + 0x10)) {
        operator_delete((void *)local_390._0_8_);
      }
      if (newtype.super_IVariant._vptr_IVariant != (_func_int **)&newtype.width) {
        operator_delete(newtype.super_IVariant._vptr_IVariant);
      }
      uVar6 = type_to_consumed_locations(this,&type);
      if (uVar6 != 0) {
        do {
          local_390._0_4_ = uVar5;
          newtype.super_IVariant._vptr_IVariant = (_func_int **)active_locations;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)active_locations,local_390,&newtype);
          uVar5 = uVar5 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
    pp_Var14 = (_func_int **)
               CONCAT44(semantic._M_dataplus._M_p._4_4_,(int)semantic._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(semantic._M_dataplus._M_p._4_4_,(int)semantic._M_dataplus._M_p) ==
        &semantic.field_2) goto LAB_00212a32;
  }
  operator_delete(pp_Var14);
LAB_00212a32:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)binding._M_dataplus._M_p != &binding.field_2) {
    operator_delete(binding._M_dataplus._M_p);
  }
  type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0035b448;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&type.member_name_cache._M_h);
  type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &type.member_type_index_redirection.stack_storage) {
    free(type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &type.member_types.stack_storage) {
    free(type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)type.array_size_literal.super_VectorView<bool>.ptr !=
      &type.array_size_literal.stack_storage) {
    free(type.array_size_literal.super_VectorView<bool>.ptr);
  }
  type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)type.array.super_VectorView<unsigned_int>.ptr !=
      &type.array.stack_storage) {
    free(type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

	auto &m = ir.meta[var.self].decoration;
	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (m.decoration_flags.get(DecorationLocation))
			location_number = m.location;
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;
				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", semantic, "_", i, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
		statement(variable_decl(type, name), " : ", binding, ";");
}